

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O1

bool __thiscall slang::ast::CoverageOptionSetter::isTypeOption(CoverageOptionSetter *this)

{
  ExpressionSyntax *pEVar1;
  byte bVar2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  string_view sVar6;
  
  pEVar1 = (((this->syntax).ptr)->expr).ptr;
  if ((pEVar1->super_SyntaxNode).kind == AssignmentExpression) {
    piVar4 = *(int **)&pEVar1[1].super_SyntaxNode;
    if (*piVar4 == 0x1a1) {
      bVar5 = **(int **)(piVar4 + 6) == 0xe5;
      if (bVar5) {
        sVar6 = parsing::Token::valueText((Token *)(*(int **)(piVar4 + 6) + 6));
        if (sVar6._M_len == 0xb) {
          iVar3 = bcmp(sVar6._M_str,"type_option",0xb);
          piVar4 = (int *)(ulong)(iVar3 == 0);
        }
        else {
          piVar4 = (int *)0x0;
        }
      }
    }
    else {
      bVar5 = false;
    }
    bVar2 = (byte)piVar4;
    if (bVar5) goto LAB_0032f912;
  }
  bVar2 = 0;
LAB_0032f912:
  return (bool)(bVar2 & 1);
}

Assistant:

constexpr T get() const {
        SLANG_ASSERT(ptr);
        return ptr;
    }